

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt
strscan_dec(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex10,int32_t neg,uint32_t dig)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  TValue *pTVar5;
  ulong uVar6;
  uint64_t local_2d0;
  double local_2c8;
  uint local_2bc;
  uint local_2b8;
  uint local_294;
  ulong uStack_290;
  uint32_t i_3;
  uint64_t x_1;
  uint local_280;
  uint32_t cy_1;
  uint32_t i_2;
  uint32_t d_1;
  uint32_t cy;
  uint32_t i_1;
  int32_t idig;
  int32_t ex2;
  uint32_t lo;
  uint32_t hi;
  double n;
  uint64_t x;
  uint8_t *xis;
  uint32_t d;
  uint32_t i;
  uint8_t *xip;
  uint8_t xi [512];
  uint local_2c;
  int32_t neg_local;
  int32_t ex10_local;
  uint32_t opt_local;
  StrScanFmt fmt_local;
  TValue *o_local;
  uint8_t *p_local;
  
  _d = &xip;
  if (dig == 0) {
    local_2c = 0;
    xip._0_1_ = 0;
  }
  else {
    xis._4_4_ = dig;
    local_2c = ex10;
    if (800 < dig) {
      local_2c = (dig - 800) + ex10;
      xis._4_4_ = 800;
    }
    o_local = (TValue *)p;
    if (((local_2c ^ xis._4_4_) & 1) != 0) {
      if (*p == '.') {
        o_local = (TValue *)(p + 1);
        bVar1 = p[1];
      }
      else {
        bVar1 = *p;
      }
      xip._0_1_ = bVar1 & 0xf;
      _d = (uint8_t **)((long)&xip + 1);
      xis._4_4_ = xis._4_4_ - 1;
      o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
    }
    for (; 1 < xis._4_4_; xis._4_4_ = xis._4_4_ - 2) {
      if (*(char *)o_local == '.') {
        bVar1 = *(byte *)((long)&(o_local->gcr).gcptr64 + 1);
        o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
      }
      else {
        bVar1 = *(byte *)o_local;
      }
      pTVar5 = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
      if (*(byte *)pTVar5 == 0x2e) {
        bVar2 = *(byte *)((long)&(o_local->gcr).gcptr64 + 2);
        o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 2);
      }
      else {
        bVar2 = *(byte *)pTVar5;
        o_local = pTVar5;
      }
      *(byte *)_d = (bVar1 & 0xf) * '\n' + (bVar2 & 0xf);
      o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
      _d = (uint8_t **)((long)_d + 1);
    }
    if (xis._4_4_ != 0) {
      if (*(char *)o_local == '.') {
        bVar1 = *(byte *)((long)&(o_local->gcr).gcptr64 + 1);
        o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
      }
      else {
        bVar1 = *(byte *)o_local;
      }
      *(byte *)_d = (bVar1 & 0xf) * '\n';
      local_2c = local_2c - 1;
      dig = dig + 1;
      o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
      _d = (uint8_t **)((long)_d + 1);
    }
    if (dig < 0x321) {
      for (; 0 < (int)local_2c && dig < 0x13; local_2c = local_2c - 2) {
        *(char *)_d = '\0';
        dig = dig + 2;
        _d = (uint8_t **)((long)_d + 1);
      }
    }
    else {
      do {
        if (*(char *)o_local == '.') {
          cVar3 = *(char *)((long)&(o_local->gcr).gcptr64 + 1);
          o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
        }
        else {
          cVar3 = *(char *)o_local;
        }
        if (cVar3 != '0') {
          *(byte *)((long)_d + -1) = *(byte *)((long)_d + -1) | 1;
          break;
        }
        o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
        dig = dig - 1;
      } while (800 < dig);
      dig = 800;
    }
  }
  ex10_local = fmt;
  if ((dig < 0x15) && (local_2c == 0)) {
    n = (double)(ulong)(byte)xip;
    x = (uint64_t)&xip;
    while (x = x + 1, x < _d) {
      n = (double)((long)n * 100 + (ulong)*(byte *)x);
    }
    if ((dig != 0x14) || (((byte)xip < 0x13 && ((long)n < 0)))) {
      local_2bc = SUB84(n,0);
      if (fmt == STRSCAN_INT) {
        if (((opt & 2) == 0) && ((ulong)n < (ulong)(neg + 0x80000000))) {
          local_2b8 = local_2bc;
          if (neg != 0) {
            local_2b8 = (local_2bc ^ 0xffffffff) + 1;
          }
          (o->field_4).i = local_2b8;
          return STRSCAN_INT;
        }
        if ((opt & 0x10) != 0) goto LAB_00148a1f;
        ex10_local = 1;
      }
      else {
        if (fmt == STRSCAN_U32) {
LAB_00148a1f:
          if ((ulong)n >> 0x20 == 0) {
            if (neg != 0) {
              local_2bc = (local_2bc ^ 0xffffffff) + 1;
            }
            (o->field_4).i = local_2bc;
            return STRSCAN_U32;
          }
          return STRSCAN_ERROR;
        }
        if (fmt - STRSCAN_I64 < 2) {
          if (neg == 0) {
            local_2c8 = n;
          }
          else {
            local_2c8 = (double)(((ulong)n ^ 0xffffffffffffffff) + 1);
          }
          o->u64 = (uint64_t)local_2c8;
          return fmt;
        }
      }
      if (-1 < (long)n) {
        _lo = (double)(long)n;
        if (neg != 0) {
          _lo = -_lo;
        }
        o->n = _lo;
        return ex10_local;
      }
    }
  }
  if (ex10_local == 3) {
    if ((opt & 0x10) != 0) {
      return STRSCAN_ERROR;
    }
    ex10_local = 1;
  }
  else if (3 < (uint)ex10_local) {
    return STRSCAN_ERROR;
  }
  ex2 = 0;
  idig = (int)_d - (int)&xip;
  i_1 = 0;
  cy = idig + ((int)local_2c >> 1);
  if ((int)cy < 0x9c) {
    if ((int)cy < -0xa3) {
      local_2d0 = 0x8000000000000000;
      if (neg == 0) {
        local_2d0 = 0;
      }
      o->u64 = local_2d0;
    }
    else {
      while ((int)cy < 9 && (int)cy < (int)(idig - ex2 & 0x1ffU)) {
        i_2 = 0;
        i_1 = i_1 - 6;
        d_1 = idig;
        while( true ) {
          d_1 = d_1 - 1 & 0x1ff;
          uVar4 = (uint)xi[(ulong)d_1 - 8] * 0x40 + i_2;
          i_2 = uVar4 / 100;
          uVar4 = uVar4 % 100;
          xi[(ulong)d_1 - 8] = (uint8_t)uVar4;
          if (d_1 == ex2) break;
          if ((uVar4 == 0) && (d_1 == (idig - 1U & 0x1ff))) {
            idig = d_1;
          }
        }
        if (i_2 != 0) {
          ex2 = ex2 - 1U & 0x1ff;
          if (xi[(ulong)(idig - 1U & 0x1ff) - 8] == '\0') {
            idig = idig - 1U & 0x1ff;
          }
          else if (ex2 == idig) {
            idig = idig - 1U & 0x1ff;
            uVar6 = (ulong)(idig - 1U & 0x1ff);
            xi[uVar6 - 8] = xi[uVar6 - 8] | xi[(ulong)(uint)idig - 8];
          }
          xi[(ulong)(uint)ex2 - 8] = (uint8_t)i_2;
          cy = cy + 1;
        }
      }
LAB_00148e3f:
      if (9 < (int)cy) {
        local_280 = ex2;
        x_1._4_4_ = 0;
        i_1 = i_1 + 6;
        do {
          bVar1 = xi[(ulong)local_280 - 8];
          xi[(ulong)local_280 - 8] = (uint8_t)(bVar1 + x_1._4_4_ >> 6);
          x_1._4_4_ = (bVar1 + x_1._4_4_ & 0x3f) * 100;
          if ((xi[(ulong)local_280 - 8] == '\0') && (local_280 == ex2)) {
            ex2 = ex2 + 1U & 0x1ff;
            cy = cy - 1;
          }
          local_280 = local_280 + 1 & 0x1ff;
        } while (local_280 != idig);
        for (; x_1._4_4_ != 0; x_1._4_4_ = (x_1._4_4_ & 0x3f) * 100) {
          if (ex2 == idig) {
            uVar6 = (ulong)(idig - 1U & 0x1ff);
            xi[uVar6 - 8] = xi[uVar6 - 8] | 1;
            break;
          }
          xi[(ulong)(uint)idig - 8] = (uint8_t)(x_1._4_4_ >> 6);
          idig = idig + 1U & 0x1ff;
        }
        goto LAB_00148e3f;
      }
      uStack_290 = (ulong)xi[(ulong)(uint)ex2 - 8];
      while( true ) {
        local_294 = ex2 + 1U & 0x1ff;
        cy = cy - 1;
        if ((int)cy < 1 || local_294 == idig) break;
        uStack_290 = uStack_290 * 100 + (ulong)xi[(ulong)local_294 - 8];
        ex2 = local_294;
      }
      if (local_294 == idig) {
        while (cy = cy - 1, -1 < (int)cy) {
          uStack_290 = uStack_290 * 100;
        }
      }
      else {
        uStack_290 = uStack_290 << 1;
        i_1 = i_1 - 1;
        do {
          if (xi[(ulong)local_294 - 8] != '\0') {
            uStack_290 = uStack_290 | 1;
            break;
          }
          local_294 = local_294 + 1 & 0x1ff;
        } while (local_294 != idig);
      }
      strscan_double(uStack_290,o,i_1,neg);
    }
  }
  else if (neg == 0) {
    o->u64 = 0x7ff0000000000000;
  }
  else {
    o->u64 = 0xfff0000000000000;
  }
  return ex10_local;
}

Assistant:

static StrScanFmt strscan_dec(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex10, int32_t neg, uint32_t dig)
{
  uint8_t xi[STRSCAN_DDIG], *xip = xi;

  if (dig) {
    uint32_t i = dig;
    if (i > STRSCAN_MAXDIG) {
      ex10 += (int32_t)(i - STRSCAN_MAXDIG);
      i = STRSCAN_MAXDIG;
    }
    /* Scan unaligned leading digit. */
    if (((ex10^i) & 1))
      *xip++ = ((*p != '.' ? *p : *++p) & 15), i--, p++;
    /* Scan aligned double-digits. */
    for ( ; i > 1; i -= 2) {
      uint32_t d = 10 * ((*p != '.' ? *p : *++p) & 15); p++;
      *xip++ = d + ((*p != '.' ? *p : *++p) & 15); p++;
    }
    /* Scan and realign trailing digit. */
    if (i) *xip++ = 10 * ((*p != '.' ? *p : *++p) & 15), ex10--, dig++, p++;

    /* Summarize rounding-effect of excess digits. */
    if (dig > STRSCAN_MAXDIG) {
      do {
	if ((*p != '.' ? *p : *++p) != '0') { xip[-1] |= 1; break; }
	p++;
      } while (--dig > STRSCAN_MAXDIG);
      dig = STRSCAN_MAXDIG;
    } else {  /* Simplify exponent. */
      while (ex10 > 0 && dig <= 18) *xip++ = 0, ex10 -= 2, dig += 2;
    }
  } else {  /* Only got zeros. */
    ex10 = 0;
    xi[0] = 0;
  }

  /* Fast path for numbers in integer format (but handles e.g. 1e6, too). */
  if (dig <= 20 && ex10 == 0) {
    uint8_t *xis;
    uint64_t x = xi[0];
    double n;
    for (xis = xi+1; xis < xip; xis++) x = x * 100 + *xis;
    if (!(dig == 20 && (xi[0] > 18 || (int64_t)x >= 0))) {  /* No overflow? */
      /* Format-specific handling. */
      switch (fmt) {
      case STRSCAN_INT:
	if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
	  o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	  return STRSCAN_INT;  /* Fast path for 32 bit integers. */
	}
	if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; goto plainnumber; }
	/* fallthrough */
      case STRSCAN_U32:
	if ((x >> 32) != 0) return STRSCAN_ERROR;
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_U32;
      case STRSCAN_I64:
      case STRSCAN_U64:
	o->u64 = neg ? ~x+1u : x;
	return fmt;
      default:
      plainnumber:  /* Fast path for plain numbers < 2^63. */
	if ((int64_t)x < 0) break;
	n = (double)(int64_t)x;
	if (neg) n = -n;
	o->n = n;
	return fmt;
      }
    }
  }

  /* Slow non-integer path. */
  if (fmt == STRSCAN_INT) {
    if ((opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
    fmt = STRSCAN_NUM;
  } else if (fmt > STRSCAN_INT) {
    return STRSCAN_ERROR;
  }
  {
    uint32_t hi = 0, lo = (uint32_t)(xip-xi);
    int32_t ex2 = 0, idig = (int32_t)lo + (ex10 >> 1);

    lj_assertX(lo > 0 && (ex10 & 1) == 0, "bad lo %d ex10 %d", lo, ex10);

    /* Handle simple overflow/underflow. */
    if (idig > 310/2) { if (neg) setminfV(o); else setpinfV(o); return fmt; }
    else if (idig < -326/2) { o->n = neg ? -0.0 : 0.0; return fmt; }

    /* Scale up until we have at least 17 or 18 integer part digits. */
    while (idig < 9 && idig < DLEN(lo, hi)) {
      uint32_t i, cy = 0;
      ex2 -= 6;
      for (i = DPREV(lo); ; i = DPREV(i)) {
	uint32_t d = (xi[i] << 6) + cy;
	cy = (((d >> 2) * 5243) >> 17); d = d - cy * 100;  /* Div/mod 100. */
	xi[i] = (uint8_t)d;
	if (i == hi) break;
	if (d == 0 && i == DPREV(lo)) lo = i;
      }
      if (cy) {
	hi = DPREV(hi);
	if (xi[DPREV(lo)] == 0) lo = DPREV(lo);
	else if (hi == lo) { lo = DPREV(lo); xi[DPREV(lo)] |= xi[lo]; }
	xi[hi] = (uint8_t)cy; idig++;
      }
    }

    /* Scale down until no more than 17 or 18 integer part digits remain. */
    while (idig > 9) {
      uint32_t i = hi, cy = 0;
      ex2 += 6;
      do {
	cy += xi[i];
	xi[i] = (cy >> 6);
	cy = 100 * (cy & 0x3f);
	if (xi[i] == 0 && i == hi) hi = DNEXT(hi), idig--;
	i = DNEXT(i);
      } while (i != lo);
      while (cy) {
	if (hi == lo) { xi[DPREV(lo)] |= 1; break; }
	xi[lo] = (cy >> 6); lo = DNEXT(lo);
	cy = 100 * (cy & 0x3f);
      }
    }

    /* Collect integer part digits and convert to rescaled double. */
    {
      uint64_t x = xi[hi];
      uint32_t i;
      for (i = DNEXT(hi); --idig > 0 && i != lo; i = DNEXT(i))
	x = x * 100 + xi[i];
      if (i == lo) {
	while (--idig >= 0) x = x * 100;
      } else {  /* Gather round bit from remaining digits. */
	x <<= 1; ex2--;
	do {
	  if (xi[i]) { x |= 1; break; }
	  i = DNEXT(i);
	} while (i != lo);
      }
      strscan_double(x, o, ex2, neg);
    }
  }
  return fmt;
}